

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U>::rehash
          (SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U> *this)

{
  uint uVar1;
  uint *puVar2;
  int iVar3;
  undefined4 extraout_var;
  uint *puVar4;
  uint *item;
  uint i;
  uint *oldData;
  uint oldBucketCount;
  SmallDenseSet<unsigned_int,_SmallDenseMapUnsignedHasher,_32U> *this_local;
  
  uVar1 = this->bucketCount;
  puVar2 = this->data;
  this->bucketCount = this->bucketCount << 1;
  if (this->allocator == (Allocator *)0x0) {
    puVar4 = (uint *)(*(code *)NULLC::alloc)(((ulong)this->bucketCount & 0x3fffffff) << 2);
    this->data = puVar4;
  }
  else {
    iVar3 = (*this->allocator->_vptr_Allocator[2])();
    this->data = (uint *)CONCAT44(extraout_var,iVar3);
  }
  NULLC::fillMemory(this->data,0,(ulong)this->bucketCount << 2);
  this->count = 0;
  for (item._4_4_ = 0; item._4_4_ < uVar1; item._4_4_ = item._4_4_ + 1) {
    if (puVar2[item._4_4_] != 0) {
      insert(this,puVar2 + item._4_4_);
    }
  }
  if (puVar2 != this->storage) {
    if (this->allocator == (Allocator *)0x0) {
      (*(code *)NULLC::dealloc)(puVar2);
    }
    else {
      (*this->allocator->_vptr_Allocator[3])(this->allocator,puVar2);
    }
  }
  return;
}

Assistant:

void rehash()
	{
		unsigned oldBucketCount = bucketCount;
		Key *oldData = data;

		bucketCount *= 2;

		if(allocator)
			data = (Key*)allocator->alloc(sizeof(Key) * bucketCount);
		else
			data = (Key*)NULLC::alloc(sizeof(Key) * bucketCount);

		NULLC::fillMemory(data, 0, sizeof(Key) * bucketCount);

		count = 0;

		for(unsigned i = 0; i < oldBucketCount; i++)
		{
			Key &item = oldData[i];

			if(item == Key())
				continue;

			insert(item);
		}

		if(oldData != storage)
		{
			if(allocator)
				allocator->dealloc(oldData);
			else
				NULLC::dealloc(oldData);
		}
	}